

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

bool __thiscall
QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate *this,QFileSystemNode *node)

{
  __normal_iterator<const_QRegularExpression_*,_std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>_>
  __first;
  bool bVar1;
  bool bVar2;
  Int IVar3;
  anon_class_8_1_898f5b00_for__M_pred in_RSI;
  vector<QRegularExpression,_std::allocator<QRegularExpression>_> *in_RDI;
  long in_FS_OFFSET;
  anon_class_8_1_898f5b00_for__M_pred matchesNodeFileName;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  __normal_iterator<const_QRegularExpression_*,_std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>_>
  __last;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  QFlagsStorageHelper<QDir::Filter,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __last._M_current = (QRegularExpression *)in_RDI;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0xaa6586);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar2 = QFileSystemNode::isDir
                      ((QFileSystemNode *)
                       CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT24(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8))));
    bVar1 = false;
    if (bVar2) {
      local_c.super_QFlagsStorage<QDir::Filter>.i =
           (QFlagsStorage<QDir::Filter>)
           QFlags<QDir::Filter>::operator&
                     ((QFlags<QDir::Filter> *)in_RDI,
                      (uint)CONCAT12(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac));
      IVar3 = ::QFlags::operator_cast_to_int((QFlags *)&local_c);
      bVar1 = IVar3 != 0;
    }
    if (bVar1) {
      bVar1 = true;
    }
    else {
      std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::begin(in_RDI);
      std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::end(in_RDI);
      __first._M_current._7_1_ = in_stack_ffffffffffffffdf;
      __first._M_current._0_7_ = in_stack_ffffffffffffffd8;
      bVar1 = std::
              any_of<__gnu_cxx::__normal_iterator<QRegularExpression_const*,std::vector<QRegularExpression,std::allocator<QRegularExpression>>>,QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate::QFileSystemNode_const*)const::__0>
                        (__first,__last,in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QFileSystemModelPrivate::passNameFilters(const QFileSystemNode *node) const
{
#if QT_CONFIG(regularexpression)
    if (nameFilters.isEmpty())
        return true;

    // Check the name regularexpression filters
    if (!(node->isDir() && (filters & QDir::AllDirs))) {
        const auto matchesNodeFileName = [node](const QRegularExpression &re)
        {
            return node->fileName.contains(re);
        };
        return std::any_of(nameFiltersRegexps.begin(),
                           nameFiltersRegexps.end(),
                           matchesNodeFileName);
    }
#else
    Q_UNUSED(node);
#endif
    return true;
}